

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

bitset_container_t * bitset_container_from_array(array_container_t *ac)

{
  int iVar1;
  bitset_container_t *bitset;
  array_container_t *in_RDI;
  int i;
  int limit;
  bitset_container_t *ans;
  int local_18;
  
  bitset = bitset_container_create();
  iVar1 = array_container_cardinality(in_RDI);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    bitset_container_set(bitset,in_RDI->array[local_18]);
  }
  return bitset;
}

Assistant:

bitset_container_t *bitset_container_from_array(const array_container_t *ac) {
    bitset_container_t *ans = bitset_container_create();
    int limit = array_container_cardinality(ac);
    for (int i = 0; i < limit; ++i) bitset_container_set(ans, ac->array[i]);
    return ans;
}